

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O0

void __thiscall
IContactList::ConfigSave(IContactList *this,IConfigManager *pConfigManager,char *pCmdStr)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *pDst;
  char *pSrc;
  int i;
  char *pEnd;
  char aBuf [128];
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  char *in_stack_ffffffffffffff30;
  char *local_c0;
  char *local_b8;
  int local_ac;
  char local_88 [124];
  char acStack_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = acStack_c;
  for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x3e08); local_ac = local_ac + 1) {
    str_copy(in_stack_ffffffffffffff30,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),0);
    in_stack_ffffffffffffff30 = local_88;
    iVar2 = str_length((char *)0x12d568);
    in_stack_ffffffffffffff30[iVar2] = '\"';
    local_b8 = (char *)(in_RDI + 8 + (long)local_ac * 0x7c);
    pcVar1 = in_stack_ffffffffffffff30 + iVar2;
    while( true ) {
      local_c0 = pcVar1 + 1;
      in_stack_ffffffffffffff2f = *local_b8 != '\0' && local_c0 < pcVar3;
      if (*local_b8 == '\0' || local_c0 >= pcVar3) break;
      if ((*local_b8 == '\"') || (*local_b8 == '\\')) {
        *local_c0 = '\\';
        local_c0 = pcVar1 + 2;
      }
      *local_c0 = *local_b8;
      local_b8 = local_b8 + 1;
      pcVar1 = local_c0;
    }
    *local_c0 = '\"';
    pcVar1[2] = ' ';
    pcVar1[3] = '\"';
    local_c0 = pcVar1 + 4;
    local_b8 = (char *)(in_RDI + (long)local_ac * 0x7c + 0x49);
    while (in_stack_ffffffffffffff2e = *local_b8 != '\0' && local_c0 < pcVar3,
          *local_b8 != '\0' && local_c0 < pcVar3) {
      if ((*local_b8 == '\"') || (*local_b8 == '\\')) {
        *local_c0 = '\\';
        local_c0 = local_c0 + 1;
      }
      *local_c0 = *local_b8;
      local_c0 = local_c0 + 1;
      local_b8 = local_b8 + 1;
    }
    *local_c0 = '\"';
    local_c0[1] = '\0';
    (**(code **)(*in_RSI + 0x40))(in_RSI,local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IContactList::ConfigSave(IConfigManager *pConfigManager, const char* pCmdStr)
{
	char aBuf[128];
	const char *pEnd = aBuf+sizeof(aBuf)-4;
	for(int i = 0; i < this->m_NumContacts; ++i)
	{
		str_copy(aBuf, pCmdStr, sizeof(aBuf));

		const char *pSrc = this->m_aContacts[i].m_aName;
		char *pDst = aBuf+str_length(aBuf);
		*pDst++ = '"';
		while(*pSrc && pDst < pEnd)
		{
			if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
				*pDst++ = '\\';
			*pDst++ = *pSrc++;
		}
		*pDst++ = '"';
		*pDst++ = ' ';

		pSrc = this->m_aContacts[i].m_aClan;
		*pDst++ = '"';
		while(*pSrc && pDst < pEnd)
		{
			if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
				*pDst++ = '\\';
			*pDst++ = *pSrc++;
		}
		*pDst++ = '"';
		*pDst++ = 0;

		pConfigManager->WriteLine(aBuf);
	}
}